

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# num_parse.h
# Opt level: O2

double mvm::num::parse<double,8ul,mvm::num::big_endian_tag>(uint8_t *bytes)

{
  double dVar1;
  array<unsigned_char,_8UL> bytes_arr;
  to_endian<8UL,_mvm::num::big_endian_tag,_mvm::num::little_endian_tag> local_9;
  array<unsigned_char,_8UL> local_8;
  
  local_8 = details::to_endian<8ul,mvm::num::big_endian_tag,mvm::num::little_endian_tag>::
            bytify_swap<0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul>(&local_9,bytes);
  dVar1 = parse_floating<double,8ul>(&local_8);
  return dVar1;
}

Assistant:

auto parse(uint8_t const *bytes) {
  auto bytes_arr = details::to_endian<N, Endian, little_endian_tag>()(bytes);

  if constexpr (std::is_floating_point_v<T>) {
    return parse_floating<T>(bytes_arr);
  } else if constexpr (std::is_integral_v<T> && std::is_unsigned_v<T>) {
    return parse_unsigned<T>(bytes_arr);
  } else if constexpr (std::is_integral_v<T> && std::is_signed_v<T>) {
    return parse_signed<T>(bytes_arr);
  }
}